

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

void update_counts_and_reset_suite(void)

{
  greatest_info.setup = (undefined1 *)0x0;
  greatest_info.setup_udata = (void *)0x0;
  greatest_info.teardown = (undefined1 *)0x0;
  greatest_info.teardown_udata = (void *)0x0;
  greatest_info.passed = greatest_info.suite.passed + greatest_info.passed;
  greatest_info.failed = greatest_info.suite.failed + greatest_info.failed;
  greatest_info.skipped = greatest_info.suite.skipped + greatest_info.skipped;
  greatest_info.tests_run = greatest_info.suite.tests_run + greatest_info.tests_run;
  memset(&greatest_info.suite,0,0x30);
  greatest_info.col = 0;
  return;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}